

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int BrotliEncoderCompressStream
              (BrotliEncoderState *s,BrotliEncoderOperation op,size_t *available_in,
              uint8_t **next_in,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  anon_union_16_2_c961180f_for_tiny_buf_ *__dest;
  MemoryManager *pMVar1;
  byte bVar2;
  int iVar3;
  BrotliEncoderStreamState BVar4;
  size_t out_bytes;
  ulong uVar5;
  uint32_t *puVar6;
  uint8_t *puVar7;
  uint8_t *__dest_00;
  long lVar8;
  uint8_t *puVar9;
  int *table;
  ulong uVar10;
  size_t sVar11;
  bool bVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  uint32_t *local_a8;
  uint32_t *local_90;
  uint8_t *local_88;
  uint8_t *local_80;
  size_t storage_ix;
  uint8_t *local_68;
  uint local_60;
  BrotliEncoderStreamState local_5c;
  uint8_t *local_58;
  size_t *local_50;
  uint16_t *local_48;
  uint8_t *local_40;
  size_t local_38;
  
  EnsureInitialized(s);
  if ((ulong)s->remaining_metadata_bytes_ != 0xffffffff) {
    if (op != BROTLI_OPERATION_EMIT_METADATA) {
      return 0;
    }
    if (*available_in != (ulong)s->remaining_metadata_bytes_) {
      return 0;
    }
LAB_00125f34:
    if ((s->params).size_hint == 0) {
      uVar5 = s->input_pos_ - s->last_processed_pos_;
      if (0x3fffffff < uVar5) {
        uVar5 = 0x40000000;
      }
      (s->params).size_hint = uVar5;
    }
    if (*available_in < 0x1000001) {
      if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
        s->remaining_metadata_bytes_ = (uint32_t)*available_in;
        s->stream_state_ = BROTLI_STREAM_METADATA_HEAD;
      }
      if (s->stream_state_ - BROTLI_STREAM_METADATA_HEAD < 2) {
        __dest = &s->tiny_buf_;
        do {
          while( true ) {
            do {
              iVar3 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
            } while (iVar3 != 0);
            if (s->available_out_ != 0) {
              return 1;
            }
            if (s->input_pos_ != s->last_flush_pos_) break;
            if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD) {
              s->next_out_ = (uint8_t *)__dest;
              uVar16 = s->remaining_metadata_bytes_;
              bVar2 = s->last_bytes_bits_;
              uVar13 = (ulong)bVar2;
              *(uint16_t *)&s->tiny_buf_ = s->last_bytes_;
              s->last_bytes_ = 0;
              s->last_bytes_bits_ = '\0';
              *(ulong *)((long)&s->tiny_buf_ + (ulong)(bVar2 >> 3)) =
                   (ulong)(s->tiny_buf_).u8[bVar2 >> 3];
              uVar10 = uVar13 + 1 >> 3;
              uVar15 = (ulong)(bVar2 + 3 >> 3);
              uVar5 = uVar13 + 4;
              *(ulong *)((long)&s->tiny_buf_ + uVar10) =
                   3L << ((byte)(uVar13 + 1) & 7) | (ulong)(s->tiny_buf_).u8[uVar10];
              *(ulong *)((long)&s->tiny_buf_ + uVar15) = (ulong)(s->tiny_buf_).u8[uVar15];
              if ((ulong)uVar16 == 1) {
                uVar14 = 0;
LAB_001261a0:
                uVar10 = uVar13 + (ulong)uVar14 * 8;
                *(ulong *)((long)__dest + (uVar5 >> 3)) =
                     (ulong)uVar14 << ((byte)uVar5 & 7) | (ulong)__dest->u8[uVar5 >> 3];
                uVar5 = uVar13 + 6 >> 3;
                *(ulong *)((long)__dest + uVar5) =
                     (ulong)uVar16 - 1 << ((byte)(uVar13 + 6) & 7) | (ulong)__dest->u8[uVar5];
              }
              else {
                if (uVar16 != 0) {
                  uVar14 = 0x1f;
                  if (uVar16 - 1 != 0) {
                    for (; uVar16 - 1 >> uVar14 == 0; uVar14 = uVar14 - 1) {
                    }
                  }
                  uVar14 = (uVar14 ^ 0xffffffe0) + 0x28 >> 3;
                  goto LAB_001261a0;
                }
                *(ulong *)((long)__dest + (uVar5 >> 3)) = (ulong)__dest->u8[uVar5 >> 3];
                uVar10 = uVar13;
              }
              s->available_out_ = uVar10 + 0xd >> 3;
              s->stream_state_ = BROTLI_STREAM_METADATA_BODY;
            }
            else {
              uVar16 = s->remaining_metadata_bytes_;
              uVar5 = (ulong)uVar16;
              if (uVar5 == 0) {
                s->remaining_metadata_bytes_ = 0xffffffff;
                s->stream_state_ = BROTLI_STREAM_PROCESSING;
                return 1;
              }
              uVar10 = *available_out;
              if (uVar10 == 0) {
                if (0xf < uVar16) {
                  uVar16 = 0x10;
                }
                uVar5 = (ulong)uVar16;
                s->next_out_ = (uint8_t *)__dest;
                memcpy(__dest,*next_in,uVar5);
                *next_in = *next_in + uVar5;
                *available_in = *available_in - uVar5;
                s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - uVar16;
                s->available_out_ = uVar5;
              }
              else {
                if (uVar5 < uVar10) {
                  uVar10 = uVar5;
                }
                memcpy(*next_out,*next_in,uVar10);
                *next_in = *next_in + uVar10;
                *available_in = *available_in - uVar10;
                s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - (int)uVar10;
                *next_out = *next_out + uVar10;
                *available_out = *available_out - uVar10;
              }
            }
          }
          iVar3 = EncodeData(s,0,1,&s->available_out_,&s->next_out_);
        } while (iVar3 != 0);
      }
    }
    return 0;
  }
  if (op == BROTLI_OPERATION_EMIT_METADATA) goto LAB_00125f34;
  if (s->stream_state_ - BROTLI_STREAM_METADATA_HEAD < 2) {
    return 0;
  }
  if ((s->stream_state_ != BROTLI_STREAM_PROCESSING) && (*available_in != 0)) {
    return 0;
  }
  uVar16 = (s->params).quality;
  if (1 < uVar16) {
    pMVar1 = &s->memory_manager_;
    do {
      uVar13 = s->input_pos_ - s->last_processed_pos_;
      EnsureInitialized(s);
      uVar10 = 1L << ((byte)(s->params).lgblock & 0x3f);
      uVar5 = uVar10 - uVar13;
      bVar18 = uVar5 == 0;
      if (uVar10 < uVar13) {
        uVar5 = 0;
      }
      if ((uVar10 < uVar13 || bVar18) || (uVar15 = *available_in, uVar15 == 0)) {
        iVar3 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
        if (iVar3 != 0) goto LAB_001266cf;
        iVar3 = 3;
        if (((s->available_out_ == 0) && (op != BROTLI_OPERATION_PROCESS || uVar10 <= uVar13)) &&
           (s->stream_state_ == BROTLI_STREAM_PROCESSING)) {
          uVar5 = *available_in;
          bVar18 = uVar5 == 0;
          if ((s->params).size_hint == 0) {
            uVar10 = s->input_pos_ - s->last_processed_pos_;
            sVar11 = uVar10 + uVar5;
            if (0x3fffffff < sVar11) {
              sVar11 = 0x40000000;
            }
            if (0x3fffffff < (uVar10 | uVar5)) {
              sVar11 = 0x40000000;
            }
            (s->params).size_hint = sVar11;
          }
          bVar12 = op == BROTLI_OPERATION_FINISH && bVar18;
          iVar3 = EncodeData(s,(uint)bVar12,(uint)(op == BROTLI_OPERATION_FLUSH && bVar18),
                             &s->available_out_,&s->next_out_);
          if (iVar3 == 0) {
            iVar3 = 1;
          }
          else {
            if (bVar18 && (op == BROTLI_OPERATION_FLUSH || op == BROTLI_OPERATION_FINISH)) {
              s->stream_state_ = bVar12 + BROTLI_STREAM_FLUSH_REQUESTED;
            }
            iVar3 = 2;
          }
        }
      }
      else {
        if (uVar5 < uVar15) {
          uVar15 = uVar5;
        }
        puVar7 = *next_in;
        EnsureInitialized(s);
        uVar16 = (uint)uVar15;
        if (((s->ringbuffer_).pos_ == 0) && (uVar15 < (s->ringbuffer_).tail_size_)) {
          (s->ringbuffer_).pos_ = uVar16;
          __dest_00 = (uint8_t *)BrotliAllocate(pMVar1,(ulong)(uVar16 + 2) + 7);
          puVar9 = (s->ringbuffer_).data_;
          if (puVar9 != (uint8_t *)0x0) {
            memcpy(__dest_00,puVar9,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
            BrotliFree(pMVar1,(s->ringbuffer_).data_);
            (s->ringbuffer_).data_ = (uint8_t *)0x0;
          }
          (s->ringbuffer_).data_ = __dest_00;
          (s->ringbuffer_).cur_size_ = uVar16;
          (s->ringbuffer_).buffer_ = __dest_00 + 2;
          __dest_00[1] = '\0';
          (s->ringbuffer_).buffer_[-2] = '\0';
          lVar8 = 0;
          do {
            (s->ringbuffer_).buffer_[lVar8 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
            lVar8 = lVar8 + 1;
          } while (lVar8 != 7);
          memcpy((s->ringbuffer_).buffer_,puVar7,uVar15);
        }
        else {
          uVar14 = (s->ringbuffer_).total_size_;
          if ((s->ringbuffer_).cur_size_ < uVar14) {
            local_68 = puVar7;
            puVar9 = (uint8_t *)BrotliAllocate(pMVar1,(ulong)(uVar14 + 2) + 7);
            puVar7 = (s->ringbuffer_).data_;
            if (puVar7 != (uint8_t *)0x0) {
              memcpy(puVar9,puVar7,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
              BrotliFree(pMVar1,(s->ringbuffer_).data_);
              (s->ringbuffer_).data_ = (uint8_t *)0x0;
            }
            (s->ringbuffer_).data_ = puVar9;
            (s->ringbuffer_).cur_size_ = uVar14;
            (s->ringbuffer_).buffer_ = puVar9 + 2;
            puVar9[1] = '\0';
            (s->ringbuffer_).buffer_[-2] = '\0';
            lVar8 = 0;
            do {
              (s->ringbuffer_).buffer_[lVar8 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
              lVar8 = lVar8 + 1;
            } while (lVar8 != 7);
            (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 2] = '\0';
            (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 1] = '\0';
            puVar7 = local_68;
          }
          uVar14 = (s->ringbuffer_).tail_size_;
          uVar17 = (s->ringbuffer_).mask_ & (s->ringbuffer_).pos_;
          uVar5 = (ulong)uVar17;
          if (uVar17 < uVar14) {
            uVar10 = uVar14 - uVar5;
            if (uVar15 < uVar10) {
              uVar10 = uVar15;
            }
            memcpy((s->ringbuffer_).buffer_ + uVar5 + (s->ringbuffer_).size_,puVar7,uVar10);
          }
          if ((ulong)(s->ringbuffer_).size_ < uVar5 + uVar15) {
            uVar10 = (s->ringbuffer_).total_size_ - uVar5;
            if (uVar15 < uVar10) {
              uVar10 = uVar15;
            }
            memcpy((s->ringbuffer_).buffer_ + uVar5,puVar7,uVar10);
            puVar9 = (s->ringbuffer_).buffer_;
            lVar8 = (s->ringbuffer_).size_ - uVar5;
            puVar7 = puVar7 + lVar8;
            uVar5 = uVar15 - lVar8;
          }
          else {
            puVar9 = (s->ringbuffer_).buffer_ + uVar5;
            uVar5 = uVar15;
          }
          memcpy(puVar9,puVar7,uVar5);
          puVar7 = (s->ringbuffer_).buffer_;
          uVar14 = (s->ringbuffer_).pos_;
          puVar7[-2] = puVar7[(s->ringbuffer_).size_ - 2];
          puVar7 = (s->ringbuffer_).buffer_;
          puVar7[-1] = puVar7[(s->ringbuffer_).size_ - 1];
          (s->ringbuffer_).pos_ =
               (uVar16 & 0x7fffffff) + ((s->ringbuffer_).pos_ & 0x7fffffff) | uVar14 & 0x80000000;
        }
        s->input_pos_ = s->input_pos_ + uVar15;
        uVar16 = (s->ringbuffer_).pos_;
        if (uVar16 <= (s->ringbuffer_).mask_) {
          puVar7 = (s->ringbuffer_).buffer_;
          puVar9 = puVar7 + (ulong)uVar16 + 3;
          puVar9[0] = '\0';
          puVar9[1] = '\0';
          puVar9[2] = '\0';
          puVar9[3] = '\0';
          puVar7 = puVar7 + uVar16;
          puVar7[0] = '\0';
          puVar7[1] = '\0';
          puVar7[2] = '\0';
          puVar7[3] = '\0';
        }
        *next_in = *next_in + uVar15;
        *available_in = *available_in - uVar15;
LAB_001266cf:
        iVar3 = 2;
      }
    } while (iVar3 == 2);
    if (iVar3 == 1) {
      return 0;
    }
    goto LAB_00126a2b;
  }
  uVar13 = 1L << ((byte)(s->params).lgwin & 0x3f);
  uVar5 = *available_in;
  uVar10 = uVar13;
  if (uVar5 < uVar13) {
    uVar10 = uVar5;
  }
  sVar11 = 0x20000;
  if (uVar10 < 0x20000) {
    sVar11 = uVar10;
  }
  pMVar1 = &s->memory_manager_;
  if (uVar16 == 1) {
    if ((s->command_buf_ == (uint32_t *)0x0) && (0x1ffff < uVar10)) {
      puVar6 = (uint32_t *)BrotliAllocate(pMVar1,0x80000);
      s->command_buf_ = puVar6;
      puVar7 = (uint8_t *)BrotliAllocate(pMVar1,0x20000);
      s->literal_buf_ = puVar7;
    }
    local_a8 = s->command_buf_;
    if (local_a8 != (uint32_t *)0x0) {
      local_80 = s->literal_buf_;
      goto LAB_00126792;
    }
    if (uVar5 == 0) {
      local_a8 = (uint32_t *)0x0;
      local_80 = (uint8_t *)0x0;
    }
    else {
      local_a8 = (uint32_t *)BrotliAllocate(pMVar1,sVar11 * 4);
      local_80 = (uint8_t *)BrotliAllocate(pMVar1,sVar11);
    }
    local_90 = local_a8;
    local_88 = local_80;
  }
  else {
    local_80 = (uint8_t *)0x0;
    local_a8 = (uint32_t *)0x0;
LAB_00126792:
    local_88 = (uint8_t *)0x0;
    local_90 = (uint32_t *)0x0;
  }
  local_40 = s->cmd_depths_;
  local_48 = s->cmd_bits_;
  local_50 = &s->cmd_code_numbits_;
  local_58 = s->cmd_code_;
  local_60 = op - BROTLI_OPERATION_FLUSH;
  local_5c = (op == BROTLI_OPERATION_FINISH) + BROTLI_STREAM_FLUSH_REQUESTED;
LAB_001267f7:
  do {
    iVar3 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
  } while (iVar3 != 0);
  if (((s->available_out_ == 0) && (s->stream_state_ == BROTLI_STREAM_PROCESSING)) &&
     (uVar5 = *available_in, op != BROTLI_OPERATION_PROCESS || uVar5 != 0)) {
    uVar10 = uVar5;
    if (uVar5 > uVar13) {
      uVar10 = uVar13;
    }
    storage_ix = (size_t)s->last_bytes_bits_;
    BVar4 = BROTLI_STREAM_FLUSH_REQUESTED;
    if (op != BROTLI_OPERATION_FLUSH || uVar5 != 0) goto code_r0x00126881;
    goto LAB_001269f7;
  }
  BrotliFree(pMVar1,local_90);
  BrotliFree(pMVar1,local_88);
LAB_00126a2b:
  if (s->stream_state_ != BROTLI_STREAM_FLUSH_REQUESTED) {
    return 1;
  }
  if (s->available_out_ != 0) {
    return 1;
  }
  s->stream_state_ = BROTLI_STREAM_PROCESSING;
  s->next_out_ = (uint8_t *)0x0;
  return 1;
code_r0x00126881:
  local_68 = (uint8_t *)(uVar10 * 2 + 0x1f7);
  puVar7 = (uint8_t *)*available_out;
  if (puVar7 < local_68) {
    puVar9 = GetBrotliStorage(s,(size_t)local_68);
  }
  else {
    puVar9 = *next_out;
  }
  uVar16 = (uint)(op == BROTLI_OPERATION_FINISH && uVar5 <= uVar13);
  *puVar9 = (uint8_t)s->last_bytes_;
  puVar9[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
  table = GetHashTable(s,(s->params).quality,uVar10,&local_38);
  if ((s->params).quality == 0) {
    BrotliCompressFragmentFast
              (pMVar1,*next_in,uVar10,uVar16,table,local_38,local_40,local_48,local_50,local_58,
               &storage_ix,puVar9);
  }
  else {
    BrotliCompressFragmentTwoPass
              (pMVar1,*next_in,uVar10,uVar16,local_a8,local_80,table,local_38,&storage_ix,puVar9);
  }
  *next_in = *next_in + uVar10;
  *available_in = *available_in - uVar10;
  uVar10 = storage_ix >> 3;
  if (puVar7 < local_68) {
    s->next_out_ = puVar9;
    s->available_out_ = uVar10;
  }
  else {
    *next_out = *next_out + uVar10;
    *available_out = *available_out - uVar10;
    sVar11 = uVar10 + s->total_out_;
    s->total_out_ = sVar11;
    if (total_out != (size_t *)0x0) {
      *total_out = sVar11;
    }
  }
  s->last_bytes_ = (ushort)puVar9[storage_ix >> 3];
  s->last_bytes_bits_ = (byte)storage_ix & 7;
  BVar4 = local_5c;
  if (local_60 < 2 && uVar5 <= uVar13) {
LAB_001269f7:
    s->stream_state_ = BVar4;
  }
  goto LAB_001267f7;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompressStream(
    BrotliEncoderState* s, BrotliEncoderOperation op, size_t* available_in,
    const uint8_t** next_in, size_t* available_out,uint8_t** next_out,
    size_t* total_out) {
  if (!EnsureInitialized(s)) return BROTLI_FALSE;

  /* Unfinished metadata block; check requirements. */
  if (s->remaining_metadata_bytes_ != BROTLI_UINT32_MAX) {
    if (*available_in != s->remaining_metadata_bytes_) return BROTLI_FALSE;
    if (op != BROTLI_OPERATION_EMIT_METADATA) return BROTLI_FALSE;
  }

  if (op == BROTLI_OPERATION_EMIT_METADATA) {
    UpdateSizeHint(s, 0);  /* First data metablock might be emitted here. */
    return ProcessMetadata(
        s, available_in, next_in, available_out, next_out, total_out);
  }

  if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD ||
      s->stream_state_ == BROTLI_STREAM_METADATA_BODY) {
    return BROTLI_FALSE;
  }

  if (s->stream_state_ != BROTLI_STREAM_PROCESSING && *available_in != 0) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return BrotliEncoderCompressStreamFast(s, op, available_in, next_in,
        available_out, next_out, total_out);
  }
  while (BROTLI_TRUE) {
    size_t remaining_block_size = RemainingInputBlockSize(s);

    if (remaining_block_size != 0 && *available_in != 0) {
      size_t copy_input_size =
          BROTLI_MIN(size_t, remaining_block_size, *available_in);
      CopyInputToRingBuffer(s, copy_input_size, *next_in);
      *next_in += copy_input_size;
      *available_in -= copy_input_size;
      continue;
    }

    if (InjectFlushOrPushOutput(s, available_out, next_out, total_out)) {
      continue;
    }

    /* Compress data only when internal output buffer is empty, stream is not
       finished and there is no pending flush request. */
    if (s->available_out_ == 0 &&
        s->stream_state_ == BROTLI_STREAM_PROCESSING) {
      if (remaining_block_size == 0 || op != BROTLI_OPERATION_PROCESS) {
        BROTLI_BOOL is_last = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FINISH);
        BROTLI_BOOL force_flush = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FLUSH);
        BROTLI_BOOL result;
        UpdateSizeHint(s, *available_in);
        result = EncodeData(s, is_last, force_flush,
            &s->available_out_, &s->next_out_);
        if (!result) return BROTLI_FALSE;
        if (force_flush) s->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
        if (is_last) s->stream_state_ = BROTLI_STREAM_FINISHED;
        continue;
      }
    }
    break;
  }
  CheckFlushComplete(s);
  return BROTLI_TRUE;
}